

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

string * __thiscall
anon_unknown.dwarf_e7b893::TransformReplace::Transform
          (string *__return_storage_ptr__,TransformReplace *this,string *input)

{
  bool bVar1;
  transform_error *this_00;
  string local_a0;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar1 = cmStringReplaceHelper::Replace(&this->ReplaceHelper,input,__return_storage_ptr__);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  this_00 = (transform_error *)__cxa_allocate_exception(0x10);
  local_50.View_._M_len = 0x27;
  local_50.View_._M_str = "sub-command TRANSFORM, action REPLACE: ";
  local_80.View_._M_str = (this->ReplaceHelper).ErrorString._M_dataplus._M_p;
  local_80.View_._M_len = (this->ReplaceHelper).ErrorString._M_string_length;
  cmStrCat<char[2]>(&local_a0,&local_50,&local_80,(char (*) [2])0x614660);
  transform_error::transform_error(this_00,&local_a0);
  __cxa_throw(this_00,&(anonymous_namespace)::transform_error::typeinfo,
              std::runtime_error::~runtime_error);
}

Assistant:

std::string Transform(const std::string& input) override
  {
    // Scan through the input for all matches.
    std::string output;

    if (!this->ReplaceHelper.Replace(input, output)) {
      throw transform_error(cmStrCat("sub-command TRANSFORM, action REPLACE: ",
                                     this->ReplaceHelper.GetError(), "."));
    }

    return output;
  }